

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcElectricFlowStorageDeviceType::~IfcElectricFlowStorageDeviceType
          (IfcElectricFlowStorageDeviceType *this)

{
  ~IfcElectricFlowStorageDeviceType
            ((IfcElectricFlowStorageDeviceType *)
             &this[-1].super_IfcFlowStorageDeviceType.super_IfcDistributionFlowElementType.
              super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
              super_IfcTypeObject.field_0x48);
  return;
}

Assistant:

IfcElectricFlowStorageDeviceType() : Object("IfcElectricFlowStorageDeviceType") {}